

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O2

Node * Sequence_append(Node *a,Node *e)

{
  Node *pNVar1;
  
  if (a == (Node *)0x0) {
    __assert_fail("a",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tokuhirom[P]pvip/3rd/greg/tree.c"
                  ,0xd8,"Node *Sequence_append(Node *, Node *)");
  }
  pNVar1 = makeSequence(a);
  if ((pNVar1->rule).variables != (Node *)0x0) {
    if (e != (Node *)0x0) {
      (((pNVar1->rule).variables)->rule).next = e;
      (pNVar1->rule).variables = e;
      return pNVar1;
    }
    __assert_fail("e",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tokuhirom[P]pvip/3rd/greg/tree.c"
                  ,0xdb,"Node *Sequence_append(Node *, Node *)");
  }
  __assert_fail("a->sequence.last",
                "/workspace/llm4binary/github/license_all_cmakelists_25/tokuhirom[P]pvip/3rd/greg/tree.c"
                ,0xda,"Node *Sequence_append(Node *, Node *)");
}

Assistant:

Node *Sequence_append(Node *a, Node *e)
{
  assert(a);
  a= makeSequence(a);
  assert(a->sequence.last);
  assert(e);
  a->sequence.last->any.next= e;
  a->sequence.last= e;
  return a;
}